

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall SpiAnalyzerSettings::SetSettingsFromInterfaces(SpiAnalyzerSettings *this)

{
  byte bVar1;
  reference pvVar2;
  size_type sVar3;
  double dVar4;
  byte local_15a;
  Channel local_130 [16];
  Channel local_120 [16];
  Channel local_110 [16];
  Channel local_100 [16];
  Channel local_f0 [16];
  Channel local_e0 [16];
  Channel local_d0 [16];
  Channel local_c0 [23];
  byte local_a9;
  Channel local_a8 [16];
  Channel local_98 [20];
  undefined4 local_84;
  undefined1 local_80 [8];
  vector<Channel,_std::allocator<Channel>_> channels;
  Channel enable;
  value_type local_58 [8];
  Channel clock;
  value_type local_38 [8];
  Channel miso;
  value_type local_28 [8];
  Channel mosi;
  SpiAnalyzerSettings *this_local;
  
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMosiChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMisoChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mEnableChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  std::vector<Channel,_std::allocator<Channel>_>::vector
            ((vector<Channel,_std::allocator<Channel>_> *)local_80);
  std::vector<Channel,_std::allocator<Channel>_>::push_back
            ((vector<Channel,_std::allocator<Channel>_> *)local_80,local_28);
  std::vector<Channel,_std::allocator<Channel>_>::push_back
            ((vector<Channel,_std::allocator<Channel>_> *)local_80,local_38);
  std::vector<Channel,_std::allocator<Channel>_>::push_back
            ((vector<Channel,_std::allocator<Channel>_> *)local_80,local_58);
  std::vector<Channel,_std::allocator<Channel>_>::push_back
            ((vector<Channel,_std::allocator<Channel>_> *)local_80,
             (value_type *)
             &channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                     ((vector<Channel,_std::allocator<Channel>_> *)local_80,0);
  sVar3 = std::vector<Channel,_std::allocator<Channel>_>::size
                    ((vector<Channel,_std::allocator<Channel>_> *)local_80);
  bVar1 = AnalyzerHelpers::DoChannelsOverlap(pvVar2,(uint)sVar3);
  if ((bVar1 & 1) == 1) {
    AnalyzerSettings::SetErrorText((char *)this);
    this_local._7_1_ = false;
  }
  else {
    local_a9 = 0;
    Channel::Channel(local_98,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator==(local_28,local_98);
    local_15a = 0;
    if ((bVar1 & 1) != 0) {
      Channel::Channel(local_a8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      local_a9 = 1;
      local_15a = Channel::operator==(local_38,local_a8);
    }
    if ((local_a9 & 1) != 0) {
      Channel::~Channel(local_a8);
    }
    Channel::~Channel(local_98);
    if ((local_15a & 1) == 0) {
      std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMosiChannelInterface);
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mMosiChannel,local_c0);
      Channel::~Channel(local_c0);
      std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMisoChannelInterface);
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mMisoChannel,local_d0);
      Channel::~Channel(local_d0);
      std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface);
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mClockChannel,local_e0);
      Channel::~Channel(local_e0);
      std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mEnableChannelInterface);
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mEnableChannel,local_f0);
      Channel::~Channel(local_f0);
      std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mShiftOrderInterface);
      dVar4 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mShiftOrder = (ShiftOrder)(long)dVar4;
      std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                (&this->mBitsPerTransferInterface);
      dVar4 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mBitsPerTransfer = (U32)(long)dVar4;
      std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                (&this->mClockInactiveStateInterface);
      dVar4 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mClockInactiveState = (BitState)(long)dVar4;
      std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mDataValidEdgeInterface);
      dVar4 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mDataValidEdge = (Edge)(long)dVar4;
      std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                (&this->mEnableActiveStateInterface);
      dVar4 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mEnableActiveState = (BitState)(long)dVar4;
      AnalyzerSettings::ClearChannels();
      Channel::Channel(local_100,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(&this->mMosiChannel,local_100);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMosiChannel,true);
      Channel::~Channel(local_100);
      Channel::Channel(local_110,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(&this->mMisoChannel,local_110);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMisoChannel,true);
      Channel::~Channel(local_110);
      Channel::Channel(local_120,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(&this->mClockChannel,local_120);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
      Channel::~Channel(local_120);
      Channel::Channel(local_130,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(&this->mEnableChannel,local_130);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mEnableChannel,true);
      Channel::~Channel(local_130);
      this_local._7_1_ = true;
    }
    else {
      AnalyzerSettings::SetErrorText((char *)this);
      this_local._7_1_ = false;
    }
  }
  local_84 = 1;
  std::vector<Channel,_std::allocator<Channel>_>::~vector
            ((vector<Channel,_std::allocator<Channel>_> *)local_80);
  Channel::~Channel((Channel *)
                    &channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  Channel::~Channel(local_58);
  Channel::~Channel(local_38);
  Channel::~Channel(local_28);
  return this_local._7_1_;
}

Assistant:

bool SpiAnalyzerSettings::SetSettingsFromInterfaces()
{
    Channel mosi = mMosiChannelInterface->GetChannel();
    Channel miso = mMisoChannelInterface->GetChannel();
    Channel clock = mClockChannelInterface->GetChannel();
    Channel enable = mEnableChannelInterface->GetChannel();

    std::vector<Channel> channels;
    channels.push_back( mosi );
    channels.push_back( miso );
    channels.push_back( clock );
    channels.push_back( enable );

    if( AnalyzerHelpers::DoChannelsOverlap( &channels[ 0 ], channels.size() ) == true )
    {
        SetErrorText( "Please select different channels for each input." );
        return false;
    }

    if( ( mosi == UNDEFINED_CHANNEL ) && ( miso == UNDEFINED_CHANNEL ) )
    {
        SetErrorText( "Please select at least one input for either MISO or MOSI." );
        return false;
    }

    mMosiChannel = mMosiChannelInterface->GetChannel();
    mMisoChannel = mMisoChannelInterface->GetChannel();
    mClockChannel = mClockChannelInterface->GetChannel();
    mEnableChannel = mEnableChannelInterface->GetChannel();

    mShiftOrder = ( AnalyzerEnums::ShiftOrder )U32( mShiftOrderInterface->GetNumber() );
    mBitsPerTransfer = U32( mBitsPerTransferInterface->GetNumber() );
    mClockInactiveState = ( BitState )U32( mClockInactiveStateInterface->GetNumber() );
    mDataValidEdge = ( AnalyzerEnums::Edge )U32( mDataValidEdgeInterface->GetNumber() );
    mEnableActiveState = ( BitState )U32( mEnableActiveStateInterface->GetNumber() );

    ClearChannels();
    AddChannel( mMosiChannel, "MOSI", mMosiChannel != UNDEFINED_CHANNEL );
    AddChannel( mMisoChannel, "MISO", mMisoChannel != UNDEFINED_CHANNEL );
    AddChannel( mClockChannel, "CLOCK", mClockChannel != UNDEFINED_CHANNEL );
    AddChannel( mEnableChannel, "ENABLE", mEnableChannel != UNDEFINED_CHANNEL );

    return true;
}